

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O2

uint __thiscall
glcts::DrawBuffersIndexedColorMasks::NumComponents(DrawBuffersIndexedColorMasks *this,GLenum format)

{
  uint uVar1;
  
  uVar1 = format - 0x8229;
  if (uVar1 < 0x14) {
    if ((0x3f01U >> (uVar1 & 0x1f) & 1) != 0) {
      return 1;
    }
    if ((0xfc004U >> (uVar1 & 0x1f) & 1) != 0) {
      return 2;
    }
  }
  uVar1 = format - 0x8d62;
  if (uVar1 < 0x2d) {
    if ((0x104104104000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      return 4;
    }
    if ((ulong)uVar1 == 0) {
      return 3;
    }
  }
  if (format - 0x8056 < 4) {
    return 4;
  }
  if (format == 0x8051) {
    return 3;
  }
  return 0;
}

Assistant:

unsigned int DrawBuffersIndexedColorMasks::NumComponents(glw::GLenum format)
{
	switch (format)
	{
	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
		return 1;
	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
		return 2;
	case GL_RGB8:
	case GL_RGB565:
		return 3;
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGB10_A2:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		return 4;
	default:
		return 0;
	}
}